

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchChoice.c
# Opt level: O0

int Aig_ManCheckAcyclic_rec(Aig_Man_t *p,Aig_Obj_t *pNode,int fVerbose)

{
  int iVar1;
  uint uVar2;
  Aig_Obj_t *pAVar3;
  char *local_40;
  Aig_Obj_t *pAStack_30;
  int fAcyclic;
  Aig_Obj_t *pFanin;
  int fVerbose_local;
  Aig_Obj_t *pNode_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ObjIsCi(pNode);
  if ((iVar1 == 0) && (iVar1 = Aig_ObjIsConst1(pNode), iVar1 == 0)) {
    iVar1 = Aig_ObjIsNode(pNode);
    if (iVar1 == 0) {
      __assert_fail("Aig_ObjIsNode(pNode)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchChoice.c"
                    ,0x107,"int Aig_ManCheckAcyclic_rec(Aig_Man_t *, Aig_Obj_t *, int)");
    }
    iVar1 = Aig_ObjIsTravIdPrevious(p,pNode);
    if (iVar1 != 0) {
      __assert_fail("!Aig_ObjIsTravIdPrevious(p, pNode)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchChoice.c"
                    ,0x109,"int Aig_ManCheckAcyclic_rec(Aig_Man_t *, Aig_Obj_t *, int)");
    }
    iVar1 = Aig_ObjIsTravIdCurrent(p,pNode);
    if (iVar1 == 0) {
      Aig_ObjSetTravIdCurrent(p,pNode);
      pAVar3 = Aig_ObjFanin0(pNode);
      iVar1 = Aig_ObjIsTravIdPrevious(p,pAVar3);
      if ((iVar1 == 0) && (iVar1 = Aig_ManCheckAcyclic_rec(p,pAVar3,fVerbose), iVar1 == 0)) {
        if (fVerbose != 0) {
          uVar2 = Aig_ObjId(pAVar3);
          Abc_Print(1," %d ->",(ulong)uVar2);
        }
        p_local._4_4_ = 0;
      }
      else {
        pAVar3 = Aig_ObjFanin1(pNode);
        iVar1 = Aig_ObjIsTravIdPrevious(p,pAVar3);
        if ((iVar1 == 0) && (iVar1 = Aig_ManCheckAcyclic_rec(p,pAVar3,fVerbose), iVar1 == 0)) {
          if (fVerbose != 0) {
            uVar2 = Aig_ObjId(pAVar3);
            Abc_Print(1," %d ->",(ulong)uVar2);
          }
          p_local._4_4_ = 0;
        }
        else {
          pAVar3 = Aig_ObjRepr(p,pNode);
          if ((pAVar3 == (Aig_Obj_t *)0x0) &&
             (pAVar3 = Aig_ObjEquiv(p,pNode), pAVar3 != (Aig_Obj_t *)0x0)) {
            for (pAStack_30 = Aig_ObjEquiv(p,pNode); pAStack_30 != (Aig_Obj_t *)0x0;
                pAStack_30 = Aig_ObjEquiv(p,pAStack_30)) {
              iVar1 = Aig_ObjIsTravIdPrevious(p,pAStack_30);
              if ((iVar1 == 0) &&
                 (iVar1 = Aig_ManCheckAcyclic_rec(p,pAStack_30,fVerbose), iVar1 == 0)) {
                if (fVerbose != 0) {
                  uVar2 = Aig_ObjId(pAStack_30);
                  Abc_Print(1," %d",(ulong)uVar2);
                  uVar2 = Aig_ObjId(pNode);
                  Abc_Print(1," (choice of %d) -> ",(ulong)uVar2);
                }
                return 0;
              }
            }
          }
          Aig_ObjSetTravIdPrevious(p,pNode);
          p_local._4_4_ = 1;
        }
      }
    }
    else {
      if (fVerbose != 0) {
        if (p->pSpec == (char *)0x0) {
          local_40 = (char *)0x0;
        }
        else {
          local_40 = p->pSpec;
        }
        Abc_Print(1,"Network \"%s\" contains combinational loop!\n",local_40);
      }
      if (fVerbose != 0) {
        uVar2 = Aig_ObjId(pNode);
        Abc_Print(1,"Node \"%d\" is encountered twice on the following path to the COs:\n",
                  (ulong)uVar2);
      }
      p_local._4_4_ = 0;
    }
  }
  else {
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

int Aig_ManCheckAcyclic_rec( Aig_Man_t * p, Aig_Obj_t * pNode, int fVerbose )
{
    Aig_Obj_t * pFanin;
    int fAcyclic;
    if ( Aig_ObjIsCi(pNode) || Aig_ObjIsConst1(pNode) )
        return 1;
    assert( Aig_ObjIsNode(pNode) );
    // make sure the node is not visited
    assert( !Aig_ObjIsTravIdPrevious(p, pNode) );
    // check if the node is part of the combinational loop
    if ( Aig_ObjIsTravIdCurrent(p, pNode) )
    {
        if ( fVerbose )
            Abc_Print( 1, "Network \"%s\" contains combinational loop!\n", p->pSpec? p->pSpec : NULL );
        if ( fVerbose )
        Abc_Print( 1, "Node \"%d\" is encountered twice on the following path to the COs:\n", Aig_ObjId(pNode) );
        return 0;
    }
    // mark this node as a node on the current path
    Aig_ObjSetTravIdCurrent( p, pNode );

    // visit the transitive fanin
    pFanin = Aig_ObjFanin0(pNode);
    // check if the fanin is visited
    if ( !Aig_ObjIsTravIdPrevious(p, pFanin) ) 
    {
        // traverse the fanin's cone searching for the loop
        if ( !(fAcyclic = Aig_ManCheckAcyclic_rec(p, pFanin, fVerbose)) )
        {
            // return as soon as the loop is detected
            if ( fVerbose )
            Abc_Print( 1, " %d ->", Aig_ObjId(pFanin) );
            return 0;
        }
    }

    // visit the transitive fanin
    pFanin = Aig_ObjFanin1(pNode);
    // check if the fanin is visited
    if ( !Aig_ObjIsTravIdPrevious(p, pFanin) ) 
    {
        // traverse the fanin's cone searching for the loop
        if ( !(fAcyclic = Aig_ManCheckAcyclic_rec(p, pFanin, fVerbose)) )
        {
            // return as soon as the loop is detected
            if ( fVerbose )
            Abc_Print( 1, " %d ->", Aig_ObjId(pFanin) );
            return 0;
        }
    }

    // visit choices
    if ( Aig_ObjRepr(p, pNode) == NULL && Aig_ObjEquiv(p, pNode) != NULL )
    {
        for ( pFanin = Aig_ObjEquiv(p, pNode); pFanin; pFanin = Aig_ObjEquiv(p, pFanin) )
        {
            // check if the fanin is visited
            if ( Aig_ObjIsTravIdPrevious(p, pFanin) ) 
                continue;
            // traverse the fanin's cone searching for the loop
            if ( (fAcyclic = Aig_ManCheckAcyclic_rec(p, pFanin, fVerbose)) )
                continue;
            // return as soon as the loop is detected
            if ( fVerbose )
            Abc_Print( 1, " %d", Aig_ObjId(pFanin) );
            if ( fVerbose )
            Abc_Print( 1, " (choice of %d) -> ", Aig_ObjId(pNode) );
            return 0;
        }
    }
    // mark this node as a visited node
    Aig_ObjSetTravIdPrevious( p, pNode );
    return 1;
}